

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delaunay.c
# Opt level: O2

void resetDelaunayTriangulation(DelaunayTriangulation *delTri)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  Edge *pEVar4;
  double dVar5;
  
  free(delTri->edges);
  if (delTri->n_points == 0) {
    iVar3 = 0;
    bVar2 = true;
  }
  else {
    dVar5 = log((double)delTri->n_points);
    iVar1 = delTri->n_points;
    dVar5 = ceil(dVar5 * 3.0 * (double)iVar1);
    iVar3 = (int)dVar5;
    bVar2 = iVar1 < 2;
  }
  delTri->n_edges_max = iVar3;
  delTri->n_edges = 0;
  delTri->n_edges_discarded = 0;
  pEVar4 = (Edge *)malloc((long)iVar3 * 0x28);
  delTri->edges = pEVar4;
  if ((bool)(pEVar4 != (Edge *)0x0 | bVar2)) {
    delTri->success = 0;
    return;
  }
  puts("ERROR: Couldn\'t allocate memory for edges");
  free(delTri);
  exit(1);
}

Assistant:

void resetDelaunayTriangulation(DelaunayTriangulation *delTri) {
	if (delTri->edges != NULL) {
		free(delTri->edges);
	}

	// (Half) Edges
	if (delTri->n_points == 0) {
		delTri->n_edges_max = 0;
	}
	else {
		delTri->n_edges_max = (GLsizei) ceil((log(delTri->n_points) * 3 * delTri->n_points));
	}

	delTri->n_edges = 0;
	delTri->n_edges_discarded = 0;
	delTri->edges = malloc(sizeof(Edge) * delTri->n_edges_max);

	if ((delTri->edges == NULL) && (delTri->n_points > 1)) {
		printf("ERROR: Couldn't allocate memory for edges\n");
		free(delTri);
		exit(1);
	}

	delTri->success = 0;
}